

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpagesetupdialog_unix.cpp
# Opt level: O2

int __thiscall
QUnixPageSetupDialogPrivate::init(QUnixPageSetupDialogPrivate *this,EVP_PKEY_CTX *ctx)

{
  QWidget *parent;
  QPrinter *this_00;
  OutputFormat outputFormat;
  QPageSetupWidget *this_01;
  QDialogButtonBox *pQVar1;
  QVBoxLayout *this_02;
  long in_FS_OFFSET;
  QObject local_60 [8];
  QObject local_58 [8];
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  parent = *(QWidget **)&(this->super_QPageSetupDialogPrivate).field_0x8;
  this_01 = (QPageSetupWidget *)operator_new(0x1f8);
  QPageSetupWidget::QPageSetupWidget((QPageSetupWidget *)this_01,parent);
  this->widget = this_01;
  this_00 = (this->super_QPageSetupDialogPrivate).printer;
  outputFormat = QPrinter::outputFormat(this_00);
  QPrinter::printerName((QString *)&local_50,(this->super_QPageSetupDialogPrivate).printer);
  QPageSetupWidget::setPrinter
            ((QPageSetupWidget *)this_01,this_00,(QPrintDevice *)0x0,outputFormat,
             (QString *)&local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  pQVar1 = (QDialogButtonBox *)operator_new(0x28);
  QDialogButtonBox::QDialogButtonBox(pQVar1,0x400400,1,parent);
  QObject::connect(local_58,(char *)pQVar1,(QObject *)"2accepted()",(char *)parent,0x1533c0);
  QMetaObject::Connection::~Connection((Connection *)local_58);
  QObject::connect(local_60,(char *)pQVar1,(QObject *)"2rejected()",(char *)parent,0x1533d6);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  this_02 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(this_02,parent);
  QBoxLayout::addWidget(this_02,this->widget,0,0);
  QBoxLayout::addWidget(this_02,pQVar1,0,0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QUnixPageSetupDialogPrivate::init()
{
    Q_Q(QPageSetupDialog);

    widget = new QPageSetupWidget(q);
    widget->setPrinter(printer, nullptr, printer->outputFormat(), printer->printerName());

    QDialogButtonBox *buttons = new QDialogButtonBox(QDialogButtonBox::Ok
                                                     | QDialogButtonBox::Cancel,
                                                     Qt::Horizontal, q);
    QObject::connect(buttons, SIGNAL(accepted()), q, SLOT(accept()));
    QObject::connect(buttons, SIGNAL(rejected()), q, SLOT(reject()));

    QVBoxLayout *lay = new QVBoxLayout(q);
    lay->addWidget(widget);
    lay->addWidget(buttons);
}